

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::Scaler::_InternalParse(Scaler *this,char *ptr,ParseContext *ctx)

{
  RepeatedField<double> *pRVar1;
  RepeatedField<double> *pRVar2;
  InternalMetadata *this_00;
  byte bVar3;
  ulong uVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double *ptr_00;
  RepeatedField<double> *object;
  uint res;
  pair<const_char_*,_unsigned_int> pVar6;
  double *local_40;
  Scaler *local_38;
  
  local_40 = (double *)ptr;
  local_38 = this;
  bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar5) {
    pRVar1 = &local_38->scalevalue_;
    pRVar2 = &local_38->shiftvalue_;
    this_00 = &(local_38->super_MessageLite)._internal_metadata_;
    do {
      bVar3 = *(byte *)local_40;
      res = (uint)bVar3;
      ptr_00 = (double *)((long)local_40 + 1);
      if ((char)bVar3 < '\0') {
        res = ((uint)bVar3 + (uint)*(byte *)ptr_00 * 0x80) - 0x80;
        if ((char)*(byte *)ptr_00 < '\0') {
          pVar6 = google::protobuf::internal::ReadTagFallback((char *)local_40,res);
          ptr_00 = (double *)pVar6.first;
          res = pVar6.second;
        }
        else {
          ptr_00 = (double *)((long)local_40 + 2);
        }
      }
      local_40 = ptr_00;
      if (res >> 3 == 2) {
        object = pRVar1;
        if ((char)res == '\x12') {
LAB_002c4362:
          local_40 = (double *)
                     google::protobuf::internal::PackedDoubleParser(object,(char *)ptr_00,ctx);
          goto LAB_002c43d7;
        }
        if ((res & 0xff) != 0x11) goto LAB_002c43a7;
        _internal_add_scalevalue(local_38,*ptr_00);
LAB_002c439f:
        local_40 = local_40 + 1;
      }
      else {
        if (res >> 3 == 1) {
          object = pRVar2;
          if ((char)res == '\n') goto LAB_002c4362;
          if ((res & 0xff) == 9) {
            _internal_add_shiftvalue(local_38,*ptr_00);
            goto LAB_002c439f;
          }
        }
LAB_002c43a7:
        if ((res == 0) || ((res & 7) == 4)) {
          if (ptr_00 == (double *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)ptr_00;
        }
        uVar4 = this_00->ptr_;
        if ((uVar4 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar4 & 0xfffffffffffffffc) + 8);
        }
        local_40 = (double *)
                   google::protobuf::internal::UnknownFieldParse(res,unknown,(char *)local_40,ctx);
LAB_002c43d7:
        if (local_40 == (double *)0x0) {
          return (char *)0x0;
        }
      }
      bVar5 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar5);
  }
  return (char *)local_40;
}

Assistant:

const char* Scaler::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated double shiftValue = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_shiftvalue(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 9) {
          _internal_add_shiftvalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      // repeated double scaleValue = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::PackedDoubleParser(_internal_mutable_scalevalue(), ptr, ctx);
          CHK_(ptr);
        } else if (static_cast<uint8_t>(tag) == 17) {
          _internal_add_scalevalue(::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr));
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}